

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> * __thiscall
Lib::OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator>::operator=
          (OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *this,
          OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator> *other)

{
  bool bVar1;
  LeafIterator LStack_48;
  
  if (this->_isSome == true) {
    Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>::
    ~Stack(&(this->_elem)._elem.init._nodeIterators);
  }
  bVar1 = other->_isSome;
  if (bVar1 == true) {
    Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator::LeafIterator
              (&LStack_48,(LeafIterator *)&other->_elem);
    Indexing::SubstitutionTree<Indexing::LiteralClause>::LeafIterator::LeafIterator
              ((LeafIterator *)&this->_elem,&LStack_48);
    Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>::
    ~Stack(&LStack_48._nodeIterators);
    bVar1 = other->_isSome;
  }
  this->_isSome = bVar1;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }